

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O0

Vec_Int_t * Amap_CreateRulesFromDsd(Amap_Lib_t *pLib,Kit_DsdNtk_t *p)

{
  int iVar1;
  int local_30;
  int i;
  int iNod;
  Vec_Int_t *vNods;
  Kit_DsdNtk_t *p_local;
  Amap_Lib_t *pLib_local;
  
  if (1 < p->nVars) {
    iVar1 = Abc_LitRegular((uint)p->Root);
    pLib_local = (Amap_Lib_t *)Amap_CreateRulesFromDsd_rec(pLib,p,iVar1);
    if (pLib_local == (Amap_Lib_t *)0x0) {
      pLib_local = (Amap_Lib_t *)0x0;
    }
    else {
      iVar1 = Abc_LitIsCompl((uint)p->Root);
      if (iVar1 != 0) {
        for (local_30 = 0; iVar1 = Vec_IntSize((Vec_Int_t *)pLib_local), local_30 < iVar1;
            local_30 = local_30 + 1) {
          iVar1 = Vec_IntEntry((Vec_Int_t *)pLib_local,local_30);
          iVar1 = Abc_LitNot(iVar1);
          Vec_IntWriteEntry((Vec_Int_t *)pLib_local,local_30,iVar1);
        }
      }
    }
    return (Vec_Int_t *)pLib_local;
  }
  __assert_fail("p->nVars >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                ,0xed,"Vec_Int_t *Amap_CreateRulesFromDsd(Amap_Lib_t *, Kit_DsdNtk_t *)");
}

Assistant:

Vec_Int_t * Amap_CreateRulesFromDsd( Amap_Lib_t * pLib, Kit_DsdNtk_t * p )
{
    Vec_Int_t * vNods;
    int iNod, i;
    assert( p->nVars >= 2 );
    vNods = Amap_CreateRulesFromDsd_rec( pLib, p, Abc_LitRegular(p->Root) );
    if ( vNods == NULL )
        return NULL;
    if ( Abc_LitIsCompl(p->Root) )
    {
        Vec_IntForEachEntry( vNods, iNod, i )
            Vec_IntWriteEntry( vNods, i, Abc_LitNot(iNod) );
    }
    return vNods;
}